

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
* __thiscall
(anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmTarget *Target,
          cmGlobalGenerator *globalGenerator)

{
  _Rb_tree_header *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  cmTarget *pcVar8;
  long lVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  iterator iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  iterator iVar13;
  string interfaceLinkLibraries;
  string element;
  string linkLibraries;
  string local_90;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  __x = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &__x->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &__x->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"INTERFACE_LINK_LIBRARIES","")
  ;
  pcVar4 = cmTarget::GetProperty((cmTarget *)this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"LINK_LIBRARIES","");
  pcVar5 = cmTarget::GetProperty((cmTarget *)this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 != (char *)0x0 || pcVar5 != (char *)0x0) {
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "";
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar4,pcVar4 + sVar6);
    pcVar4 = "";
    if (pcVar5 != (char *)0x0) {
      pcVar4 = pcVar5;
    }
    local_50 = local_40;
    sVar6 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar4,pcVar4 + sVar6);
    if (local_90._M_string_length != 0) {
      do {
        uVar7 = std::__cxx11::string::find((char)&local_90,0x3b);
        if (uVar7 == 0xffffffffffffffff) {
          uVar7 = local_90._M_string_length;
        }
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_90);
        bVar2 = cmGlobalGenerator::IsAlias((cmGlobalGenerator *)Target,(string *)&local_70);
        if (bVar2) {
          pcVar8 = cmGlobalGenerator::FindTarget
                             ((cmGlobalGenerator *)Target,(string *)&local_70,false);
          if (pcVar8 != (cmTarget *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_70);
          }
        }
        lVar9 = std::__cxx11::string::find((char *)&local_70,0x4ac9bf,0);
        if (lVar9 == -1) {
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                    ::operator[](__return_storage_ptr__,(string *)&local_70);
          *pmVar10 = LLT_SCOPE_INTERFACE;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        }
      } while (uVar7 + 1 < local_90._M_string_length);
    }
    if (local_48 != 0) {
      uVar7 = 0;
      do {
        uVar11 = std::__cxx11::string::find((char)&local_50,0x3b);
        if (uVar11 == 0xffffffffffffffff) {
          uVar11 = local_48;
        }
        __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar11 - uVar7);
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
        bVar2 = cmGlobalGenerator::IsAlias((cmGlobalGenerator *)Target,(string *)&local_70);
        if (bVar2) {
          pcVar8 = cmGlobalGenerator::FindTarget
                             ((cmGlobalGenerator *)Target,(string *)&local_70,false);
          if (pcVar8 != (cmTarget *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_70);
          }
        }
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                                   *)(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header.
                                     _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&local_70,__k);
        iVar13._M_node = &__x->_M_header;
        if ((_Rb_tree_header *)iVar12._M_node != __x) {
          iVar3 = std::__cxx11::string::compare((string *)&local_70);
          if (-1 < iVar3) {
            iVar13 = iVar12;
          }
        }
        if ((_Rb_tree_header *)iVar13._M_node == __x) {
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                    ::operator[](__return_storage_ptr__,(key_type *)&local_70);
          *pmVar10 = LLT_SCOPE_PRIVATE;
        }
        else {
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                    ::operator[](__return_storage_ptr__,(key_type *)&local_70);
          if (*pmVar10 == LLT_SCOPE_INTERFACE) {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                      ::operator[](__return_storage_ptr__,(key_type *)&local_70);
            *pmVar10 = LLT_SCOPE_PUBLIC;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        }
        uVar7 = uVar11 + 1;
      } while (uVar7 < local_48);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, LinkLibraryScopeType> getScopedLinkLibrariesFromTarget(
  cmTarget* Target, const cmGlobalGenerator* globalGenerator)
{
  char sep = ';';
  std::map<std::string, LinkLibraryScopeType> tokens;
  size_t start = 0, end = 0;

  const char* pInterfaceLinkLibraries =
    Target->GetProperty("INTERFACE_LINK_LIBRARIES");
  const char* pLinkLibraries = Target->GetProperty("LINK_LIBRARIES");

  if (!pInterfaceLinkLibraries && !pLinkLibraries) {
    return tokens; // target is not linked against any other libraries
  }

  // make sure we don't touch a null-ptr
  auto interfaceLinkLibraries =
    std::string(pInterfaceLinkLibraries ? pInterfaceLinkLibraries : "");
  auto linkLibraries = std::string(pLinkLibraries ? pLinkLibraries : "");

  // first extract interfaceLinkLibraries
  while (start < interfaceLinkLibraries.length()) {

    if ((end = interfaceLinkLibraries.find(sep, start)) == std::string::npos) {
      end = interfaceLinkLibraries.length();
    }

    std::string element = interfaceLinkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (std::string::npos == element.find("$<LINK_ONLY:", 0)) {
      // we assume first, that this library is an interface library.
      // if we find it again in the linklibraries property, we promote it to an
      // public library.
      tokens[element] = LLT_SCOPE_INTERFACE;
    } else {
      // this is an private linked static library.
      // we take care of this case in the second iterator.
    }
    start = end + 1;
  }

  // second extract linkLibraries
  start = 0;
  while (start < linkLibraries.length()) {

    if ((end = linkLibraries.find(sep, start)) == std::string::npos) {
      end = linkLibraries.length();
    }

    std::string element = linkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (tokens.find(element) == tokens.end()) {
      // this library is not found in interfaceLinkLibraries but in
      // linkLibraries.
      // this results in a private linked library.
      tokens[element] = LLT_SCOPE_PRIVATE;
    } else if (LLT_SCOPE_INTERFACE == tokens[element]) {
      // this library is found in interfaceLinkLibraries and linkLibraries.
      // this results in a public linked library.
      tokens[element] = LLT_SCOPE_PUBLIC;
    } else {
      // private and public linked libraries should not be changed anymore.
    }

    start = end + 1;
  }

  return tokens;
}